

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

long __thiscall CSIZECommand::GetFileSize(CSIZECommand *this,CClient *pClient)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  CSIZECommand *pCVar3;
  ostream *this_00;
  long size;
  FILE *file;
  int local_24;
  CClient *pCStack_20;
  int r;
  CClient *pClient_local;
  CSIZECommand *this_local;
  
  pCStack_20 = pClient;
  pClient_local = (CClient *)this;
  CClient::GetUserDir_abi_cxx11_((string *)&file,pClient);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = chdir(pcVar2);
  std::__cxx11::string::~string((string *)&file);
  local_24 = iVar1;
  if (iVar1 == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __stream = fopen(pcVar2,"rb");
    if (__stream == (FILE *)0x0) {
      this_local = (CSIZECommand *)0xffffffffffffffff;
    }
    else {
      fseek(__stream,0,2);
      pCVar3 = (CSIZECommand *)ftell(__stream);
      fclose(__stream);
      this_local = pCVar3;
    }
    return (long)this_local;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Current user dir is error,now program will exit."
                           );
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

long CSIZECommand::GetFileSize(CClient *pClient) {
    int r = chdir(pClient->GetUserDir().c_str());
    if(r == 0){
        FILE *file = fopen(m_Args.c_str(),"rb");
        if(file == NULL)
            return -1;
        else {
            fseek(file, 0, 2);
            long size = ftell(file);
            fclose(file);
            return size;
        }
    }
    else{
        cout << "Current user dir is error,now program will exit." << endl;
        exit(-1);
    }
}